

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O2

void __thiscall
TargaImage::TargaImage(TargaImage *this,char *name,int width,int height,char *comment)

{
  targa_header *this_00;
  FILE *pFVar1;
  FileDataSink *ds;
  rgb *__s;
  size_t sVar2;
  
  (this->super_Image)._vptr_Image = (_func_int **)&PTR__TargaImage_0010acb0;
  pFVar1 = fopen(name,"w");
  ds = (FileDataSink *)operator_new(0x10);
  (ds->super_DataSink)._vptr_DataSink = (_func_int **)&PTR__DataSink_0010ad08;
  ds->f = (FILE *)pFVar1;
  this->file = ds;
  this->buf_size = 1000;
  __s = (rgb *)operator_new__(3000);
  memset(__s,0,3000);
  this->buffer = __s;
  this->pos = 0;
  this_00 = &this->hdr;
  (this->hdr).text_size = '\0';
  (this->hdr).map_type = '\0';
  (this->hdr).data_type = '\0';
  (this->hdr).field_0x3 = 0;
  (this->hdr).map_org = 0;
  (this->hdr).map_len = 0;
  (this->hdr).cmap_bits = '\0';
  (this->hdr).field_0x9 = 0;
  (this->hdr).x_offset = 0;
  (this->hdr).y_offset = 0;
  (this->hdr).width = 0;
  (this->hdr).data_type = '\x02';
  (this->hdr).width = (short)width;
  (this->hdr).height = (short)height;
  (this->hdr).data_bits = '\x18';
  (this->hdr).im_type = ' ';
  if (comment != (char *)0x0) {
    sVar2 = strlen(comment);
    this_00->text_size = (char)sVar2 + '\x01';
  }
  targa_header::save(this_00,(DataSink *)ds);
  if ('\0' < this_00->text_size) {
    (*(this->file->super_DataSink)._vptr_DataSink[0xb])(this->file,comment);
    return;
  }
  return;
}

Assistant:

TargaImage::TargaImage( char const*name, int width, int height, char *comment )
{
    FILE *fp = fopen(name, "w");
    file = new FileDataSink(fp);
    buf_size = 1000;
    buffer = new rgb [buf_size];
    pos = 0;

    memset(  &hdr, 0, sizeof(hdr) );
    hdr.data_type =   2;
    hdr.width = width;
    hdr.height = height;
    hdr.data_bits =   24;
    hdr.im_type = 32;

    if(comment) hdr.text_size = strlen(comment)+1;

    hdr.save(*file);

    if(hdr.text_size > 0) file->write(comment, hdr.text_size);
}